

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isLookupResultValid
               (Texture3DView *texture,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  ulong uVar1;
  Sampler *sampler_00;
  Sampler *sampler_01;
  WrapMode WVar2;
  WrapMode WVar3;
  FilterMode FVar4;
  FilterMode FVar5;
  FilterMode FVar6;
  TextureFormat format;
  TextureFormat format_00;
  byte bVar7;
  ushort uVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  bool bVar43;
  int iVar44;
  TextureChannelClass TVar45;
  uint uVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 uVar55;
  uint uVar56;
  int iVar57;
  int iVar58;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  ulong uVar59;
  FilterMode FVar60;
  int iVar61;
  int iVar62;
  int c;
  int c_00;
  Vec2 *pVVar63;
  Vec4 *pVVar64;
  int iVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar89 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar107 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar126 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar138 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float local_7cc;
  undefined1 local_7c8 [4];
  undefined1 auStack_7c4 [4];
  undefined8 uStack_7c0;
  Vec2 uBounds1;
  Vec2 vBounds0;
  Vec2 uBounds0;
  Vec2 wBounds1;
  Vec2 wBounds0;
  Vec2 vBounds1;
  Vector<bool,_4> res;
  float fStack_624;
  Vec4 cz1;
  ColorQuad quad10;
  Vec2 uBounds0_1;
  ColorQuad quad00;
  ColorQuad quad01;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  
  fVar73 = lodBounds->m_data[0];
  fVar79 = lodBounds->m_data[1];
  fVar80 = sampler->lodThreshold;
  if (fVar73 <= fVar80) {
    local_7c8 = (undefined1  [4])fVar80;
    bVar43 = isLevelSampleResultValid
                       (texture->m_levels,sampler,sampler->magFilter,prec,coord,result);
    uVar46 = (uint)bVar43;
    if ((bVar43) || (fVar79 <= fVar80)) goto LAB_00a9297a;
LAB_00a90abf:
    FVar60 = sampler->minFilter;
    iVar61 = texture->m_numLevels;
    uVar56 = iVar61 - 1;
    if (0 < (int)uVar56 && (FVar60 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) == 0) {
      fVar73 = floorf(fVar73);
      iVar44 = (int)fVar73;
      iVar61 = iVar61 + -2;
      iVar62 = iVar61;
      if (iVar44 < iVar61) {
        iVar62 = iVar44;
      }
      if (iVar44 < 0) {
        iVar62 = 0;
      }
      fVar73 = floorf(fVar79);
      iVar44 = (int)fVar73;
      if (iVar44 < iVar61) {
        iVar61 = iVar44;
      }
      if (iVar44 < 0) {
        iVar61 = 0;
      }
      while (uVar46 = 0, iVar62 <= iVar61) {
        sampler_00 = (Sampler *)(texture->m_levels + iVar62);
        iVar62 = iVar62 + 1;
        sampler_01 = (Sampler *)(texture->m_levels + iVar62);
        if ((sampler->minFilter < FILTERMODE_LAST) &&
           ((0x32U >> (sampler->minFilter & 0x1f) & 1) != 0)) {
          WVar2 = sampler_00->wrapR;
          FVar60 = sampler_00->minFilter;
          WVar3 = sampler_01->wrapR;
          FVar4 = sampler_01->minFilter;
          FVar5 = sampler_00->magFilter;
          FVar6 = sampler_01->magFilter;
          TexVerifierUtil::computeNonNormalizedCoordBounds
                    ((TexVerifierUtil *)&uBounds0,sampler->normalizedCoords,WVar2,coord->m_data[0],
                     (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
          TexVerifierUtil::computeNonNormalizedCoordBounds
                    ((TexVerifierUtil *)&uBounds1,sampler->normalizedCoords,WVar3,coord->m_data[0],
                     (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
          TexVerifierUtil::computeNonNormalizedCoordBounds
                    ((TexVerifierUtil *)&vBounds0,sampler->normalizedCoords,FVar60,coord->m_data[1],
                     (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
          TexVerifierUtil::computeNonNormalizedCoordBounds
                    ((TexVerifierUtil *)&vBounds1,sampler->normalizedCoords,FVar4,coord->m_data[1],
                     (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
          TexVerifierUtil::computeNonNormalizedCoordBounds
                    ((TexVerifierUtil *)&wBounds0,sampler->normalizedCoords,FVar5,coord->m_data[2],
                     (prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
          TexVerifierUtil::computeNonNormalizedCoordBounds
                    ((TexVerifierUtil *)&wBounds1,sampler->normalizedCoords,FVar6,coord->m_data[2],
                     (prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
          fVar74 = floorf(vBounds0.m_data[0] + -0.5);
          fVar75 = floorf(vBounds0.m_data[1] + -0.5);
          fVar76 = floorf(wBounds0.m_data[0] + -0.5);
          fVar77 = floorf(wBounds0.m_data[1] + -0.5);
          fVar81 = vBounds1.m_data[1];
          fVar80 = wBounds1.m_data[1];
          fVar79 = uBounds0.m_data[1];
          fVar73 = uBounds1.m_data[1];
          fVar125 = uBounds1.m_data[0] + -0.5;
          fVar127 = vBounds1.m_data[0] + -0.5;
          fVar129 = wBounds1.m_data[0] + -0.5;
          fVar78 = floorf(uBounds0.m_data[0] + -0.5);
          fVar129 = floorf(fVar129);
          fVar125 = floorf(fVar125);
          fVar127 = floorf(fVar127);
          fVar79 = floorf(fVar79 + -0.5);
          fVar80 = floorf(fVar80 + -0.5);
          fVar73 = floorf(fVar73 + -0.5);
          fVar81 = floorf(fVar81 + -0.5);
          auStack_7c4 = (undefined1  [4])extraout_XMM0_Db;
          local_7c8 = (undefined1  [4])fVar81;
          uStack_7c0._0_4_ = extraout_XMM0_Dc;
          uStack_7c0._4_4_ = extraout_XMM0_Dd;
          TVar45 = getTextureChannelClass(sampler_00->wrapT);
          if (TVar45 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
            local_7cc = computeBilinearSearchStepForSnorm(prec);
          }
          else {
            local_7cc = 0.0;
            if (TVar45 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
              local_7cc = computeBilinearSearchStepForUnorm(prec);
            }
          }
          iVar44 = (int)fVar77;
          if ((int)fVar76 <= iVar44) {
            auVar92._4_4_ = -(uint)((int)fVar81 < (int)fVar127);
            auVar92._0_4_ = -(uint)((int)fVar73 < (int)fVar125);
            auVar92._8_4_ = -(uint)((int)fVar80 < (int)fVar129);
            auVar92._12_4_ = -(uint)((int)fVar79 < (int)fVar78);
            uVar46 = movmskps(iVar44,auVar92);
            iVar13 = (int)fVar76;
            do {
              iVar47 = iVar13 + 1;
              if ((int)fVar74 <= (int)fVar75) {
                iVar14 = (int)fVar74;
                do {
                  iVar48 = iVar14 + 1;
                  if ((byte)((byte)uVar46 >> 3) == 0) {
                    iVar65 = (int)fVar78;
                    do {
                      quad00.p11.m_data[0] = 0.0;
                      quad00.p11.m_data[1] = 0.0;
                      quad00.p11.m_data[2] = 0.0;
                      quad00.p11.m_data[3] = 0.0;
                      quad00.p10.m_data[0] = 0.0;
                      quad00.p10.m_data[1] = 0.0;
                      quad00.p10.m_data[2] = 0.0;
                      quad00.p10.m_data[3] = 0.0;
                      quad00.p01.m_data[0] = 0.0;
                      quad00.p01.m_data[1] = 0.0;
                      quad00.p01.m_data[2] = 0.0;
                      quad00.p01.m_data[3] = 0.0;
                      quad00.p00.m_data[0] = 0.0;
                      quad00.p00.m_data[1] = 0.0;
                      quad00.p00.m_data[2] = 0.0;
                      quad00.p00.m_data[3] = 0.0;
                      quad01.p11.m_data[0] = 0.0;
                      quad01.p11.m_data[1] = 0.0;
                      quad01.p11.m_data[2] = 0.0;
                      quad01.p11.m_data[3] = 0.0;
                      quad01.p10.m_data[0] = 0.0;
                      quad01.p10.m_data[1] = 0.0;
                      quad01.p10.m_data[2] = 0.0;
                      quad01.p10.m_data[3] = 0.0;
                      quad01.p01.m_data[0] = 0.0;
                      quad01.p01.m_data[1] = 0.0;
                      quad01.p01.m_data[2] = 0.0;
                      quad01.p01.m_data[3] = 0.0;
                      quad01.p00.m_data[0] = 0.0;
                      quad01.p00.m_data[1] = 0.0;
                      quad01.p00.m_data[2] = 0.0;
                      quad01.p00.m_data[3] = 0.0;
                      iVar49 = TexVerifierUtil::wrap(sampler->wrapS,iVar65,WVar2);
                      auVar107._8_8_ = 0;
                      auVar107._0_8_ = uStack_7c0;
                      _local_7c8 = auVar107 << 0x40;
                      c = iVar65 + 1;
                      iVar50 = TexVerifierUtil::wrap(sampler->wrapS,c,WVar2);
                      iVar51 = TexVerifierUtil::wrap(sampler->wrapT,iVar14,FVar60);
                      iVar52 = TexVerifierUtil::wrap(sampler->wrapT,iVar48,FVar60);
                      iVar53 = TexVerifierUtil::wrap(sampler->wrapR,iVar13,FVar5);
                      iVar54 = TexVerifierUtil::wrap(sampler->wrapR,iVar47,FVar5);
                      lookupQuad(&quad00,(ConstPixelBufferAccess *)sampler_00,sampler,iVar49,iVar50,
                                 iVar51,iVar52,iVar53);
                      lookupQuad(&quad01,(ConstPixelBufferAccess *)sampler_00,sampler,iVar49,iVar50,
                                 iVar51,iVar52,iVar54);
                      uVar55 = extraout_EAX;
                      fVar76 = local_7cc;
                      if (TVar45 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                        fVar76 = computeBilinearSearchStepFromFloatQuad(prec,&quad00);
                        fVar77 = computeBilinearSearchStepFromFloatQuad(prec,&quad01);
                        fVar76 = (float)(~-(uint)(fVar76 <= fVar77) & (uint)fVar77 |
                                        (uint)fVar76 & -(uint)(fVar76 <= fVar77));
                        uVar55 = extraout_EAX_00;
                      }
                      fVar136 = (uBounds0.m_data[0] + -0.5) - (float)iVar65;
                      fVar137 = (uBounds0.m_data[1] + -0.5) - (float)iVar65;
                      iVar65 = -(uint)(1.0 < fVar136);
                      iVar49 = -(uint)(1.0 < fVar137);
                      auVar89._4_4_ = iVar49;
                      auVar89._0_4_ = iVar65;
                      auVar89._8_4_ = iVar49;
                      auVar89._12_4_ = iVar49;
                      auVar88._8_8_ = auVar89._8_8_;
                      auVar88._4_4_ = iVar65;
                      auVar88._0_4_ = iVar65;
                      uVar56 = movmskpd(uVar55,auVar88);
                      fVar77 = 1.0;
                      if ((uVar56 & 1) == 0) {
                        fVar77 = fVar136;
                      }
                      fVar130 = 1.0;
                      if ((uVar56 & 2) == 0) {
                        fVar130 = fVar137;
                      }
                      fVar117 = (wBounds0.m_data[0] + -0.5) - (float)iVar13;
                      fVar121 = (wBounds0.m_data[1] + -0.5) - (float)iVar13;
                      fVar123 = (vBounds0.m_data[0] + -0.5) - (float)iVar14;
                      fVar124 = (vBounds0.m_data[1] + -0.5) - (float)iVar14;
                      auVar126._4_4_ = -(uint)(fVar121 < 0.0);
                      auVar126._0_4_ = -(uint)(fVar117 < 0.0);
                      auVar126._8_4_ = -(uint)(fVar123 < 0.0);
                      auVar126._12_4_ = -(uint)(fVar124 < 0.0);
                      uVar56 = movmskps(uVar56,auVar126);
                      fVar133 = 0.0;
                      if (((uVar56 & 4) == 0) && (fVar133 = 1.0, fVar123 <= 1.0)) {
                        fVar133 = fVar123;
                      }
                      fVar123 = 0.0;
                      if (((uVar56 & 8) == 0) && (fVar123 = 1.0, fVar124 <= 1.0)) {
                        fVar123 = fVar124;
                      }
                      fVar124 = 0.0;
                      if (((uVar56 & 1) == 0) && (fVar124 = 1.0, fVar117 <= 1.0)) {
                        fVar124 = fVar117;
                      }
                      fVar117 = 0.0;
                      if (((uVar56 & 2) == 0) && (fVar117 = 1.0, fVar121 <= 1.0)) {
                        fVar117 = fVar121;
                      }
                      if ((uVar46 & 4) == 0) {
                        fVar77 = (float)(~-(uint)(fVar136 < 0.0) & (uint)fVar77);
                        fVar130 = (float)(~-(uint)(fVar137 < 0.0) & (uint)fVar130);
                        fVar136 = quad00.p00.m_data[0];
                        fVar137 = quad00.p00.m_data[1];
                        fVar121 = quad00.p01.m_data[0];
                        fVar34 = quad00.p01.m_data[1];
                        fVar35 = quad00.p10.m_data[0];
                        fVar36 = quad00.p10.m_data[1];
                        fVar37 = quad00.p11.m_data[0];
                        fVar38 = quad00.p11.m_data[1];
                        fVar82 = (float)(~-(uint)(quad00.p01.m_data[0] <= quad00.p11.m_data[0]) &
                                         (uint)quad00.p11.m_data[0] |
                                        (uint)quad00.p01.m_data[0] &
                                        -(uint)(quad00.p01.m_data[0] <= quad00.p11.m_data[0]));
                        fVar93 = (float)(~-(uint)(quad00.p01.m_data[1] <= quad00.p11.m_data[1]) &
                                         (uint)quad00.p11.m_data[1] |
                                        (uint)quad00.p01.m_data[1] &
                                        -(uint)(quad00.p01.m_data[1] <= quad00.p11.m_data[1]));
                        fVar94 = (float)(~-(uint)(quad00.p01.m_data[2] <= quad00.p11.m_data[2]) &
                                         (uint)quad00.p11.m_data[2] |
                                        (uint)quad00.p01.m_data[2] &
                                        -(uint)(quad00.p01.m_data[2] <= quad00.p11.m_data[2]));
                        fVar95 = (float)(~-(uint)(quad00.p01.m_data[3] <= quad00.p11.m_data[3]) &
                                         (uint)quad00.p11.m_data[3] |
                                        (uint)quad00.p01.m_data[3] &
                                        -(uint)(quad00.p01.m_data[3] <= quad00.p11.m_data[3]));
                        uVar56 = -(uint)(quad00.p10.m_data[0] <= fVar82);
                        uVar66 = -(uint)(quad00.p10.m_data[1] <= fVar93);
                        uVar67 = -(uint)(quad00.p10.m_data[2] <= fVar94);
                        uVar70 = -(uint)(quad00.p10.m_data[3] <= fVar95);
                        fVar82 = (float)(~uVar56 & (uint)fVar82 |
                                        (uint)quad00.p10.m_data[0] & uVar56);
                        fVar93 = (float)(~uVar66 & (uint)fVar93 |
                                        (uint)quad00.p10.m_data[1] & uVar66);
                        fVar94 = (float)(~uVar67 & (uint)fVar94 |
                                        (uint)quad00.p10.m_data[2] & uVar67);
                        fVar95 = (float)(~uVar70 & (uint)fVar95 |
                                        (uint)quad00.p10.m_data[3] & uVar70);
                        uVar56 = -(uint)(quad00.p00.m_data[0] <= fVar82);
                        uVar66 = -(uint)(quad00.p00.m_data[1] <= fVar93);
                        uVar67 = -(uint)(quad00.p00.m_data[2] <= fVar94);
                        uVar70 = -(uint)(quad00.p00.m_data[3] <= fVar95);
                        fVar103 = (float)(~uVar56 & (uint)fVar82 |
                                         (uint)quad00.p00.m_data[0] & uVar56);
                        fVar108 = (float)(~uVar66 & (uint)fVar93 |
                                         (uint)quad00.p00.m_data[1] & uVar66);
                        fVar111 = (float)(~uVar67 & (uint)fVar94 |
                                         (uint)quad00.p00.m_data[2] & uVar67);
                        fVar114 = (float)(~uVar70 & (uint)fVar95 |
                                         (uint)quad00.p00.m_data[3] & uVar70);
                        fVar82 = quad01.p00.m_data[0];
                        fVar93 = quad01.p00.m_data[1];
                        fVar94 = quad01.p01.m_data[0];
                        fVar95 = quad01.p01.m_data[1];
                        fVar39 = quad01.p10.m_data[0];
                        fVar40 = quad01.p10.m_data[1];
                        fVar41 = quad01.p11.m_data[0];
                        fVar42 = quad01.p11.m_data[1];
                        fVar96 = (float)(~-(uint)(quad01.p01.m_data[0] <= quad01.p11.m_data[0]) &
                                         (uint)quad01.p11.m_data[0] |
                                        (uint)quad01.p01.m_data[0] &
                                        -(uint)(quad01.p01.m_data[0] <= quad01.p11.m_data[0]));
                        fVar100 = (float)(~-(uint)(quad01.p01.m_data[1] <= quad01.p11.m_data[1]) &
                                          (uint)quad01.p11.m_data[1] |
                                         (uint)quad01.p01.m_data[1] &
                                         -(uint)(quad01.p01.m_data[1] <= quad01.p11.m_data[1]));
                        fVar101 = (float)(~-(uint)(quad01.p01.m_data[2] <= quad01.p11.m_data[2]) &
                                          (uint)quad01.p11.m_data[2] |
                                         (uint)quad01.p01.m_data[2] &
                                         -(uint)(quad01.p01.m_data[2] <= quad01.p11.m_data[2]));
                        fVar102 = (float)(~-(uint)(quad01.p01.m_data[3] <= quad01.p11.m_data[3]) &
                                          (uint)quad01.p11.m_data[3] |
                                         (uint)quad01.p01.m_data[3] &
                                         -(uint)(quad01.p01.m_data[3] <= quad01.p11.m_data[3]));
                        uVar56 = -(uint)(quad01.p10.m_data[0] <= fVar96);
                        uVar66 = -(uint)(quad01.p10.m_data[1] <= fVar100);
                        uVar67 = -(uint)(quad01.p10.m_data[2] <= fVar101);
                        uVar70 = -(uint)(quad01.p10.m_data[3] <= fVar102);
                        fVar96 = (float)(~uVar56 & (uint)fVar96 |
                                        (uint)quad01.p10.m_data[0] & uVar56);
                        fVar100 = (float)(~uVar66 & (uint)fVar100 |
                                         (uint)quad01.p10.m_data[1] & uVar66);
                        fVar101 = (float)(~uVar67 & (uint)fVar101 |
                                         (uint)quad01.p10.m_data[2] & uVar67);
                        fVar102 = (float)(~uVar70 & (uint)fVar102 |
                                         (uint)quad01.p10.m_data[3] & uVar70);
                        uVar56 = -(uint)(quad01.p00.m_data[0] <= fVar96);
                        uVar66 = -(uint)(quad01.p00.m_data[1] <= fVar100);
                        uVar67 = -(uint)(quad01.p00.m_data[2] <= fVar101);
                        uVar70 = -(uint)(quad01.p00.m_data[3] <= fVar102);
                        fVar104 = (float)(~uVar56 & (uint)fVar96 |
                                         (uint)quad01.p00.m_data[0] & uVar56);
                        fVar109 = (float)(~uVar66 & (uint)fVar100 |
                                         (uint)quad01.p00.m_data[1] & uVar66);
                        fVar112 = (float)(~uVar67 & (uint)fVar101 |
                                         (uint)quad01.p00.m_data[2] & uVar67);
                        fVar115 = (float)(~uVar70 & (uint)fVar102 |
                                         (uint)quad01.p00.m_data[3] & uVar70);
                        fVar96 = (float)(~-(uint)(quad00.p11.m_data[0] <= quad00.p01.m_data[0]) &
                                         (uint)quad00.p11.m_data[0] |
                                        (uint)quad00.p01.m_data[0] &
                                        -(uint)(quad00.p11.m_data[0] <= quad00.p01.m_data[0]));
                        fVar100 = (float)(~-(uint)(quad00.p11.m_data[1] <= quad00.p01.m_data[1]) &
                                          (uint)quad00.p11.m_data[1] |
                                         (uint)quad00.p01.m_data[1] &
                                         -(uint)(quad00.p11.m_data[1] <= quad00.p01.m_data[1]));
                        fVar101 = (float)(~-(uint)(quad00.p11.m_data[2] <= quad00.p01.m_data[2]) &
                                          (uint)quad00.p11.m_data[2] |
                                         (uint)quad00.p01.m_data[2] &
                                         -(uint)(quad00.p11.m_data[2] <= quad00.p01.m_data[2]));
                        fVar102 = (float)(~-(uint)(quad00.p11.m_data[3] <= quad00.p01.m_data[3]) &
                                          (uint)quad00.p11.m_data[3] |
                                         (uint)quad00.p01.m_data[3] &
                                         -(uint)(quad00.p11.m_data[3] <= quad00.p01.m_data[3]));
                        uVar56 = -(uint)(fVar96 <= quad00.p10.m_data[0]);
                        uVar66 = -(uint)(fVar100 <= quad00.p10.m_data[1]);
                        uVar67 = -(uint)(fVar101 <= quad00.p10.m_data[2]);
                        uVar70 = -(uint)(fVar102 <= quad00.p10.m_data[3]);
                        fVar96 = (float)(~uVar56 & (uint)fVar96 |
                                        (uint)quad00.p10.m_data[0] & uVar56);
                        fVar100 = (float)(~uVar66 & (uint)fVar100 |
                                         (uint)quad00.p10.m_data[1] & uVar66);
                        fVar101 = (float)(~uVar67 & (uint)fVar101 |
                                         (uint)quad00.p10.m_data[2] & uVar67);
                        fVar102 = (float)(~uVar70 & (uint)fVar102 |
                                         (uint)quad00.p10.m_data[3] & uVar70);
                        uVar56 = -(uint)(fVar96 <= quad00.p00.m_data[0]);
                        uVar66 = -(uint)(fVar100 <= quad00.p00.m_data[1]);
                        uVar67 = -(uint)(fVar101 <= quad00.p00.m_data[2]);
                        uVar70 = -(uint)(fVar102 <= quad00.p00.m_data[3]);
                        fVar105 = (float)(~uVar56 & (uint)fVar96 |
                                         (uint)quad00.p00.m_data[0] & uVar56);
                        fVar110 = (float)(~uVar66 & (uint)fVar100 |
                                         (uint)quad00.p00.m_data[1] & uVar66);
                        fVar113 = (float)(~uVar67 & (uint)fVar101 |
                                         (uint)quad00.p00.m_data[2] & uVar67);
                        fVar116 = (float)(~uVar70 & (uint)fVar102 |
                                         (uint)quad00.p00.m_data[3] & uVar70);
                        fVar96 = (float)(~-(uint)(quad01.p11.m_data[0] <= quad01.p01.m_data[0]) &
                                         (uint)quad01.p11.m_data[0] |
                                        (uint)quad01.p01.m_data[0] &
                                        -(uint)(quad01.p11.m_data[0] <= quad01.p01.m_data[0]));
                        fVar100 = (float)(~-(uint)(quad01.p11.m_data[1] <= quad01.p01.m_data[1]) &
                                          (uint)quad01.p11.m_data[1] |
                                         (uint)quad01.p01.m_data[1] &
                                         -(uint)(quad01.p11.m_data[1] <= quad01.p01.m_data[1]));
                        fVar101 = (float)(~-(uint)(quad01.p11.m_data[2] <= quad01.p01.m_data[2]) &
                                          (uint)quad01.p11.m_data[2] |
                                         (uint)quad01.p01.m_data[2] &
                                         -(uint)(quad01.p11.m_data[2] <= quad01.p01.m_data[2]));
                        fVar102 = (float)(~-(uint)(quad01.p11.m_data[3] <= quad01.p01.m_data[3]) &
                                          (uint)quad01.p11.m_data[3] |
                                         (uint)quad01.p01.m_data[3] &
                                         -(uint)(quad01.p11.m_data[3] <= quad01.p01.m_data[3]));
                        uVar56 = -(uint)(fVar96 <= quad01.p10.m_data[0]);
                        uVar66 = -(uint)(fVar100 <= quad01.p10.m_data[1]);
                        uVar67 = -(uint)(fVar101 <= quad01.p10.m_data[2]);
                        uVar70 = -(uint)(fVar102 <= quad01.p10.m_data[3]);
                        fVar96 = (float)(~uVar56 & (uint)fVar96 |
                                        (uint)quad01.p10.m_data[0] & uVar56);
                        fVar100 = (float)(~uVar66 & (uint)fVar100 |
                                         (uint)quad01.p10.m_data[1] & uVar66);
                        fVar101 = (float)(~uVar67 & (uint)fVar101 |
                                         (uint)quad01.p10.m_data[2] & uVar67);
                        fVar102 = (float)(~uVar70 & (uint)fVar102 |
                                         (uint)quad01.p10.m_data[3] & uVar70);
                        uVar56 = -(uint)(fVar96 <= quad01.p00.m_data[0]);
                        uVar66 = -(uint)(fVar100 <= quad01.p00.m_data[1]);
                        uVar67 = -(uint)(fVar101 <= quad01.p00.m_data[2]);
                        uVar70 = -(uint)(fVar102 <= quad01.p00.m_data[3]);
                        fVar96 = (float)(~uVar56 & (uint)fVar96 |
                                        (uint)quad01.p00.m_data[0] & uVar56);
                        fVar100 = (float)(~uVar66 & (uint)fVar100 |
                                         (uint)quad01.p00.m_data[1] & uVar66);
                        fVar101 = (float)(~uVar67 & (uint)fVar101 |
                                         (uint)quad01.p00.m_data[2] & uVar67);
                        fVar102 = (float)(~uVar70 & (uint)fVar102 |
                                         (uint)quad01.p00.m_data[3] & uVar70);
                        iVar65 = (int)fVar129;
                        do {
                          iVar49 = iVar65 + 1;
                          if ((uVar46 & 2) == 0) {
                            iVar50 = (int)fVar127;
                            do {
                              iVar51 = iVar50 + 1;
                              if ((uVar46 & 1) == 0) {
                                iVar52 = (int)fVar125;
                                do {
                                  quad10.p11.m_data[0] = 0.0;
                                  quad10.p11.m_data[1] = 0.0;
                                  quad10.p11.m_data[2] = 0.0;
                                  quad10.p11.m_data[3] = 0.0;
                                  quad10.p10.m_data[0] = 0.0;
                                  quad10.p10.m_data[1] = 0.0;
                                  quad10.p10.m_data[2] = 0.0;
                                  quad10.p10.m_data[3] = 0.0;
                                  quad10.p01.m_data[0] = 0.0;
                                  quad10.p01.m_data[1] = 0.0;
                                  quad10.p01.m_data[2] = 0.0;
                                  quad10.p01.m_data[3] = 0.0;
                                  quad10.p00.m_data[0] = 0.0;
                                  quad10.p00.m_data[1] = 0.0;
                                  quad10.p00.m_data[2] = 0.0;
                                  quad10.p00.m_data[3] = 0.0;
                                  uBounds0_1.m_data[0] = 0.0;
                                  uBounds0_1.m_data[1] = 0.0;
                                  iVar53 = TexVerifierUtil::wrap(sampler->wrapS,iVar52,WVar3);
                                  c_00 = iVar52 + 1;
                                  uVar56 = TexVerifierUtil::wrap(sampler->wrapS,c_00,WVar3);
                                  uVar66 = TexVerifierUtil::wrap(sampler->wrapT,iVar50,FVar4);
                                  iVar54 = TexVerifierUtil::wrap(sampler->wrapT,iVar51,FVar4);
                                  iVar57 = TexVerifierUtil::wrap(sampler->wrapR,iVar65,FVar6);
                                  iVar58 = TexVerifierUtil::wrap(sampler->wrapR,iVar49,FVar6);
                                  lookupQuad(&quad10,(ConstPixelBufferAccess *)sampler_01,sampler,
                                             iVar53,uVar56,uVar66,iVar54,iVar57);
                                  pVVar63 = (Vec2 *)(ulong)uVar56;
                                  pVVar64 = (Vec4 *)(ulong)uVar66;
                                  lookupQuad((ColorQuad *)&uBounds0_1,
                                             (ConstPixelBufferAccess *)sampler_01,sampler,iVar53,
                                             uVar56,uVar66,iVar54,iVar58);
                                  uVar55 = extraout_EAX_01;
                                  fVar83 = local_7cc;
                                  if (TVar45 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                                    fVar83 = computeBilinearSearchStepFromFloatQuad(prec,&quad10);
                                    fVar84 = computeBilinearSearchStepFromFloatQuad
                                                       (prec,(ColorQuad *)&uBounds0_1);
                                    fVar83 = (float)(~-(uint)(fVar83 <= fVar84) & (uint)fVar84 |
                                                    (uint)fVar83 & -(uint)(fVar83 <= fVar84));
                                    uVar55 = extraout_EAX_02;
                                  }
                                  fVar118 = (vBounds1.m_data[0] + -0.5) - (float)iVar50;
                                  fVar122 = (vBounds1.m_data[1] + -0.5) - (float)iVar50;
                                  iVar53 = -(uint)(fVar118 < 0.0);
                                  iVar54 = -(uint)(fVar122 < 0.0);
                                  auVar91._4_4_ = iVar54;
                                  auVar91._0_4_ = iVar53;
                                  auVar91._8_4_ = iVar54;
                                  auVar91._12_4_ = iVar54;
                                  auVar90._8_8_ = auVar91._8_8_;
                                  auVar90._4_4_ = iVar53;
                                  auVar90._0_4_ = iVar53;
                                  uVar56 = movmskpd(uVar55,auVar90);
                                  fVar84 = 0.0;
                                  if (((uVar56 & 1) == 0) && (fVar84 = 1.0, fVar118 <= 1.0)) {
                                    fVar84 = fVar118;
                                  }
                                  _local_7c8 = ZEXT416((uint)wBounds1.m_data[1]);
                                  fVar118 = 0.0;
                                  if (((uVar56 & 2) == 0) && (fVar118 = 1.0, fVar122 <= 1.0)) {
                                    fVar118 = fVar122;
                                  }
                                  fVar16 = quad10.p00.m_data[0];
                                  fVar17 = quad10.p00.m_data[1];
                                  fVar18 = quad10.p00.m_data[2];
                                  fVar19 = quad10.p00.m_data[3];
                                  fVar20 = quad10.p01.m_data[0];
                                  fVar21 = quad10.p01.m_data[1];
                                  fVar22 = quad10.p01.m_data[2];
                                  fVar23 = quad10.p01.m_data[3];
                                  fVar24 = quad10.p10.m_data[0];
                                  fVar25 = quad10.p10.m_data[1];
                                  fVar26 = quad10.p10.m_data[2];
                                  fVar27 = quad10.p10.m_data[3];
                                  fVar28 = quad10.p11.m_data[0];
                                  fVar29 = quad10.p11.m_data[1];
                                  fVar30 = quad10.p11.m_data[2];
                                  fVar31 = quad10.p11.m_data[3];
                                  fVar122 = (float)(~-(uint)(quad10.p01.m_data[0] <=
                                                            quad10.p11.m_data[0]) &
                                                    (uint)quad10.p11.m_data[0] |
                                                   (uint)quad10.p01.m_data[0] &
                                                   -(uint)(quad10.p01.m_data[0] <=
                                                          quad10.p11.m_data[0]));
                                  fVar128 = (float)(~-(uint)(quad10.p01.m_data[1] <=
                                                            quad10.p11.m_data[1]) &
                                                    (uint)quad10.p11.m_data[1] |
                                                   (uint)quad10.p01.m_data[1] &
                                                   -(uint)(quad10.p01.m_data[1] <=
                                                          quad10.p11.m_data[1]));
                                  fVar134 = (float)(~-(uint)(quad10.p01.m_data[2] <=
                                                            quad10.p11.m_data[2]) &
                                                    (uint)quad10.p11.m_data[2] |
                                                   (uint)quad10.p01.m_data[2] &
                                                   -(uint)(quad10.p01.m_data[2] <=
                                                          quad10.p11.m_data[2]));
                                  fVar135 = (float)(~-(uint)(quad10.p01.m_data[3] <=
                                                            quad10.p11.m_data[3]) &
                                                    (uint)quad10.p11.m_data[3] |
                                                   (uint)quad10.p01.m_data[3] &
                                                   -(uint)(quad10.p01.m_data[3] <=
                                                          quad10.p11.m_data[3]));
                                  uVar56 = -(uint)(quad10.p10.m_data[0] <= fVar122);
                                  uVar66 = -(uint)(quad10.p10.m_data[1] <= fVar128);
                                  uVar67 = -(uint)(quad10.p10.m_data[2] <= fVar134);
                                  uVar70 = -(uint)(quad10.p10.m_data[3] <= fVar135);
                                  fVar122 = (float)(~uVar56 & (uint)fVar122 |
                                                   (uint)quad10.p10.m_data[0] & uVar56);
                                  fVar128 = (float)(~uVar66 & (uint)fVar128 |
                                                   (uint)quad10.p10.m_data[1] & uVar66);
                                  fVar134 = (float)(~uVar67 & (uint)fVar134 |
                                                   (uint)quad10.p10.m_data[2] & uVar67);
                                  fVar135 = (float)(~uVar70 & (uint)fVar135 |
                                                   (uint)quad10.p10.m_data[3] & uVar70);
                                  uVar56 = -(uint)(quad10.p00.m_data[0] <= fVar122);
                                  uVar66 = -(uint)(quad10.p00.m_data[1] <= fVar128);
                                  uVar67 = -(uint)(quad10.p00.m_data[2] <= fVar134);
                                  uVar70 = -(uint)(quad10.p00.m_data[3] <= fVar135);
                                  fVar122 = (float)(~uVar56 & (uint)fVar122 |
                                                   (uint)quad10.p00.m_data[0] & uVar56);
                                  fVar128 = (float)(~uVar66 & (uint)fVar128 |
                                                   (uint)quad10.p00.m_data[1] & uVar66);
                                  fVar134 = (float)(~uVar67 & (uint)fVar134 |
                                                   (uint)quad10.p00.m_data[2] & uVar67);
                                  fVar135 = (float)(~uVar70 & (uint)fVar135 |
                                                   (uint)quad10.p00.m_data[3] & uVar70);
                                  fVar32 = uBounds0_1.m_data[0];
                                  fVar33 = uBounds0_1.m_data[1];
                                  fVar140 = (float)((uint)uBounds0_1.m_data[0] &
                                                   -(uint)(uBounds0_1.m_data[0] <= 0.0));
                                  fVar141 = (float)((uint)uBounds0_1.m_data[1] &
                                                   -(uint)(uBounds0_1.m_data[1] <= 0.0));
                                  uVar56 = -(uint)(fVar122 <= fVar140);
                                  uVar66 = -(uint)(fVar128 <= fVar141);
                                  fVar134 = (float)((uint)fVar134 & -(uint)(fVar134 <= 0.0));
                                  fVar135 = (float)((uint)fVar135 & -(uint)(fVar135 <= 0.0));
                                  fVar122 = (float)(~uVar56 & (uint)fVar140 | (uint)fVar122 & uVar56
                                                   );
                                  fVar128 = (float)(~uVar66 & (uint)fVar141 | (uint)fVar128 & uVar66
                                                   );
                                  uVar56 = -(uint)(fVar104 <= fVar122);
                                  uVar66 = -(uint)(fVar109 <= fVar128);
                                  uVar67 = -(uint)(fVar112 <= fVar134);
                                  uVar70 = -(uint)(fVar115 <= fVar135);
                                  fVar97 = (float)(~uVar56 & (uint)fVar122 | (uint)fVar104 & uVar56)
                                  ;
                                  fVar139 = (float)(~uVar66 & (uint)fVar128 | (uint)fVar109 & uVar66
                                                   );
                                  fVar85 = (float)(~uVar67 & (uint)fVar134 | (uint)fVar112 & uVar67)
                                  ;
                                  fVar120 = (float)(~uVar70 & (uint)fVar135 | (uint)fVar115 & uVar70
                                                   );
                                  uVar56 = -(uint)(fVar103 <= fVar97);
                                  uVar67 = -(uint)(fVar108 <= fVar139);
                                  uVar68 = -(uint)(fVar111 <= fVar85);
                                  uVar71 = -(uint)(fVar114 <= fVar120);
                                  fVar122 = (float)(~-(uint)(quad10.p11.m_data[0] <=
                                                            quad10.p01.m_data[0]) &
                                                    (uint)quad10.p11.m_data[0] |
                                                   (uint)quad10.p01.m_data[0] &
                                                   -(uint)(quad10.p11.m_data[0] <=
                                                          quad10.p01.m_data[0]));
                                  fVar128 = (float)(~-(uint)(quad10.p11.m_data[1] <=
                                                            quad10.p01.m_data[1]) &
                                                    (uint)quad10.p11.m_data[1] |
                                                   (uint)quad10.p01.m_data[1] &
                                                   -(uint)(quad10.p11.m_data[1] <=
                                                          quad10.p01.m_data[1]));
                                  fVar134 = (float)(~-(uint)(quad10.p11.m_data[2] <=
                                                            quad10.p01.m_data[2]) &
                                                    (uint)quad10.p11.m_data[2] |
                                                   (uint)quad10.p01.m_data[2] &
                                                   -(uint)(quad10.p11.m_data[2] <=
                                                          quad10.p01.m_data[2]));
                                  fVar135 = (float)(~-(uint)(quad10.p11.m_data[3] <=
                                                            quad10.p01.m_data[3]) &
                                                    (uint)quad10.p11.m_data[3] |
                                                   (uint)quad10.p01.m_data[3] &
                                                   -(uint)(quad10.p11.m_data[3] <=
                                                          quad10.p01.m_data[3]));
                                  uVar66 = -(uint)(fVar122 <= quad10.p10.m_data[0]);
                                  uVar70 = -(uint)(fVar128 <= quad10.p10.m_data[1]);
                                  uVar69 = -(uint)(fVar134 <= quad10.p10.m_data[2]);
                                  uVar72 = -(uint)(fVar135 <= quad10.p10.m_data[3]);
                                  fVar122 = (float)(~uVar66 & (uint)fVar122 |
                                                   (uint)quad10.p10.m_data[0] & uVar66);
                                  fVar128 = (float)(~uVar70 & (uint)fVar128 |
                                                   (uint)quad10.p10.m_data[1] & uVar70);
                                  fVar140 = (float)(~uVar69 & (uint)fVar134 |
                                                   (uint)quad10.p10.m_data[2] & uVar69);
                                  fVar141 = (float)(~uVar72 & (uint)fVar135 |
                                                   (uint)quad10.p10.m_data[3] & uVar72);
                                  uVar66 = -(uint)(fVar122 <= quad10.p00.m_data[0]);
                                  uVar70 = -(uint)(fVar128 <= quad10.p00.m_data[1]);
                                  uVar69 = -(uint)(fVar140 <= quad10.p00.m_data[2]);
                                  uVar72 = -(uint)(fVar141 <= quad10.p00.m_data[3]);
                                  fVar134 = (float)(~uVar66 & (uint)fVar122 |
                                                   (uint)quad10.p00.m_data[0] & uVar66);
                                  fVar135 = (float)(~uVar70 & (uint)fVar128 |
                                                   (uint)quad10.p00.m_data[1] & uVar70);
                                  fVar131 = (float)(~uVar69 & (uint)fVar140 |
                                                   (uint)quad10.p00.m_data[2] & uVar69);
                                  fVar132 = (float)(~uVar72 & (uint)fVar141 |
                                                   (uint)quad10.p00.m_data[3] & uVar72);
                                  fVar122 = (float)((uint)uBounds0_1.m_data[0] &
                                                   -(uint)(0.0 <= uBounds0_1.m_data[0]));
                                  fVar128 = (float)((uint)uBounds0_1.m_data[1] &
                                                   -(uint)(0.0 <= uBounds0_1.m_data[1]));
                                  uVar66 = -(uint)(fVar122 <= fVar134);
                                  uVar70 = -(uint)(fVar128 <= fVar135);
                                  fVar131 = (float)((uint)fVar131 & -(uint)(0.0 <= fVar131));
                                  fVar132 = (float)((uint)fVar132 & -(uint)(0.0 <= fVar132));
                                  fVar122 = (float)(~uVar66 & (uint)fVar122 | (uint)fVar134 & uVar66
                                                   );
                                  fVar128 = (float)(~uVar70 & (uint)fVar128 | (uint)fVar135 & uVar70
                                                   );
                                  uVar66 = -(uint)(fVar122 <= fVar96);
                                  uVar70 = -(uint)(fVar128 <= fVar100);
                                  uVar69 = -(uint)(fVar131 <= fVar101);
                                  uVar72 = -(uint)(fVar132 <= fVar102);
                                  fVar140 = (float)(~uVar66 & (uint)fVar122 | (uint)fVar96 & uVar66)
                                  ;
                                  fVar141 = (float)(~uVar70 & (uint)fVar128 | (uint)fVar100 & uVar70
                                                   );
                                  fVar131 = (float)(~uVar69 & (uint)fVar131 | (uint)fVar101 & uVar69
                                                   );
                                  fVar132 = (float)(~uVar72 & (uint)fVar132 | (uint)fVar102 & uVar72
                                                   );
                                  uVar66 = -(uint)(fVar140 <= fVar105);
                                  uVar70 = -(uint)(fVar141 <= fVar110);
                                  uVar69 = -(uint)(fVar131 <= fVar113);
                                  uVar72 = -(uint)(fVar132 <= fVar116);
                                  fVar122 = (prec->colorThreshold).m_data[0];
                                  fVar128 = (prec->colorThreshold).m_data[1];
                                  fVar134 = (prec->colorThreshold).m_data[2];
                                  fVar135 = (prec->colorThreshold).m_data[3];
                                  iVar53 = -(uint)(result->m_data[0] <=
                                                   (float)(~uVar66 & (uint)fVar140 |
                                                          (uint)fVar105 & uVar66) + fVar122 &&
                                                  (float)(~uVar56 & (uint)fVar97 |
                                                         (uint)fVar103 & uVar56) - fVar122 <=
                                                  result->m_data[0]);
                                  iVar54 = -(uint)(result->m_data[1] <=
                                                   (float)(~uVar70 & (uint)fVar141 |
                                                          (uint)fVar110 & uVar70) + fVar128 &&
                                                  (float)(~uVar67 & (uint)fVar139 |
                                                         (uint)fVar108 & uVar67) - fVar128 <=
                                                  result->m_data[1]);
                                  iVar57 = -(uint)(result->m_data[2] <=
                                                   (float)(~uVar69 & (uint)fVar131 |
                                                          (uint)fVar113 & uVar69) + fVar134 &&
                                                  (float)(~uVar68 & (uint)fVar85 |
                                                         (uint)fVar111 & uVar68) - fVar134 <=
                                                  result->m_data[2]);
                                  iVar58 = -(uint)(result->m_data[3] <=
                                                   (float)(~uVar72 & (uint)fVar132 |
                                                          (uint)fVar116 & uVar72) + fVar135 &&
                                                  (float)(~uVar71 & (uint)fVar120 |
                                                         (uint)fVar114 & uVar71) - fVar135 <=
                                                  result->m_data[3]);
                                  uVar11 = -(short)(iVar53 >> 0x1f);
                                  bVar7 = (uVar11 != 0) * (uVar11 < 0x100) * -(char)(iVar53 >> 0x1f)
                                          - (0xff < uVar11);
                                  uVar11 = -(short)(iVar54 >> 0x1f);
                                  bVar8 = (uVar11 != 0) * (uVar11 < 0x100) * -(char)(iVar54 >> 0x1f)
                                          - (0xff < uVar11);
                                  uVar11 = -(short)(iVar57 >> 0x1f);
                                  bVar9 = (uVar11 != 0) * (uVar11 < 0x100) * -(char)(iVar57 >> 0x1f)
                                          - (0xff < uVar11);
                                  uVar11 = -(short)(iVar58 >> 0x1f);
                                  bVar10 = (uVar11 != 0) * (uVar11 < 0x100) *
                                           -(char)(iVar58 >> 0x1f) - (0xff < uVar11);
                                  res.m_data[0] =
                                       (bool)((prec->colorMask).m_data[0] ^ 1U |
                                             (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7)
                                             );
                                  res.m_data[1] =
                                       (bool)((prec->colorMask).m_data[1] ^ 1U |
                                             (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8)
                                             );
                                  res.m_data[2] =
                                       (bool)((prec->colorMask).m_data[2] ^ 1U |
                                             (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9)
                                             );
                                  res.m_data[3] =
                                       (bool)((prec->colorMask).m_data[3] ^ 1U |
                                             (bVar10 != 0) * (bVar10 < 0x100) * bVar10 -
                                             (0xff < bVar10));
                                  if (res.m_data[0] != false) {
                                    auVar138._0_4_ = (uBounds1.m_data[0] + -0.5) - (float)iVar52;
                                    auVar138._4_4_ = (wBounds1.m_data[0] + -0.5) - (float)iVar65;
                                    auVar138._8_8_ = 0;
                                    fVar128 = (uBounds1.m_data[1] + -0.5) - (float)iVar52;
                                    fVar134 = (wBounds1.m_data[1] + -0.5) - (float)iVar65;
                                    auVar12._4_4_ = fVar134;
                                    auVar12._0_4_ = fVar128;
                                    auVar12._8_8_ = 0;
                                    auVar92 = minps(_DAT_00ad7f10,auVar12);
                                    auVar107 = minps(_DAT_00ad7f10,auVar138);
                                    fVar122 = (float)(-(uint)(0.0 <= auVar138._4_4_) &
                                                     auVar107._4_4_);
                                    fVar128 = (float)(-(uint)(0.0 <= fVar128) & auVar92._0_4_);
                                    fVar134 = (float)(-(uint)(0.0 <= fVar134) & auVar92._4_4_);
                                    fVar83 = (float)(~-(uint)(fVar76 <= fVar83) & (uint)fVar83 |
                                                    -(uint)(fVar76 <= fVar83) & (uint)fVar76);
                                    uVar59 = 0xffffffffffffffff;
                                    do {
                                      if (uVar59 == 2) goto LAB_00a91b65;
                                      uVar1 = uVar59 + 1;
                                      lVar15 = uVar59 + 2;
                                      uVar59 = uVar1;
                                    } while (res.m_data[lVar15] != false);
                                    if (2 < uVar1) {
LAB_00a91b65:
                                      if (fVar77 < fVar130 + fVar83) {
                                        fVar135 = fVar77;
                                        do {
                                          if (fVar133 < fVar123 + fVar83) {
                                            fVar141 = (float)(~-(uint)(fVar135 <= fVar130) &
                                                              (uint)fVar130 |
                                                             -(uint)(fVar135 <= fVar130) &
                                                             (uint)fVar135);
                                            fVar131 = 1.0 - fVar141;
                                            fVar140 = fVar133;
                                            do {
                                              fVar97 = (float)(~-(uint)(fVar140 <= fVar123) &
                                                               (uint)fVar123 |
                                                              -(uint)(fVar140 <= fVar123) &
                                                              (uint)fVar140);
                                              fVar139 = 1.0 - fVar97;
                                              for (fVar132 = fVar124; fVar132 < fVar117 + fVar83;
                                                  fVar132 = fVar132 + fVar83) {
                                                fVar85 = (float)(~-(uint)(fVar132 <= fVar117) &
                                                                 (uint)fVar117 |
                                                                -(uint)(fVar132 <= fVar117) &
                                                                (uint)fVar132);
                                                res.m_data = (bool  [4])
                                                             (fVar85 * (fVar97 * fVar141 * fVar41 +
                                                                       fVar97 * fVar131 * fVar94 +
                                                                       fVar139 * fVar141 * fVar39 +
                                                                       fVar139 * fVar131 * fVar82) +
                                                             (1.0 - fVar85) *
                                                             (fVar97 * fVar141 * fVar37 +
                                                             fVar97 * fVar131 * fVar121 +
                                                             fVar139 * fVar141 * fVar35 +
                                                             fVar139 * fVar131 * fVar136));
                                                fStack_624 = fVar85 * (fVar97 * fVar141 * fVar42 +
                                                                      fVar97 * fVar131 * fVar95 +
                                                                      fVar139 * fVar141 * fVar40 +
                                                                      fVar139 * fVar131 * fVar93) +
                                                             (1.0 - fVar85) *
                                                             (fVar97 * fVar141 * fVar38 +
                                                             fVar97 * fVar131 * fVar34 +
                                                             fVar139 * fVar141 * fVar36 +
                                                             fVar139 * fVar131 * fVar137);
                                                for (fVar85 = (float)(-(uint)(0.0 <= auVar138._0_4_)
                                                                     & auVar107._0_4_);
                                                    fVar85 < fVar83 + fVar128;
                                                    fVar85 = fVar85 + fVar83) {
                                                  if (fVar84 < fVar83 + fVar118) {
                                                    fVar106 = (float)(~-(uint)(fVar85 <= fVar128) &
                                                                      (uint)fVar128 |
                                                                     -(uint)(fVar85 <= fVar128) &
                                                                     (uint)fVar85);
                                                    fVar98 = 1.0 - fVar106;
                                                    fVar120 = fVar84;
                                                    do {
                                                      fVar99 = (float)(~-(uint)(fVar120 <= fVar118)
                                                                       & (uint)fVar118 |
                                                                      -(uint)(fVar120 <= fVar118) &
                                                                      (uint)fVar120);
                                                      fVar86 = 1.0 - fVar99;
                                                      for (fVar119 = fVar122;
                                                          fVar119 < fVar83 + fVar134;
                                                          fVar119 = fVar119 + fVar83) {
                                                        auStack_7c4 = (undefined1  [4])fVar122;
                                                        local_7c8 = (undefined1  [4])fVar119;
                                                        uStack_7c0._0_4_ = fVar122;
                                                        uStack_7c0._4_4_ = fVar122;
                                                        fVar87 = (float)(~-(uint)(fVar119 <= fVar134
                                                                                 ) & (uint)fVar134 |
                                                                        -(uint)(fVar119 <= fVar134)
                                                                        & (uint)fVar119);
                                                        fVar142 = 1.0 - fVar87;
                                                        cz1.m_data[0] =
                                                             fVar87 * (fVar99 * fVar106 * 0.0 +
                                                                      fVar99 * fVar98 * 0.0 +
                                                                      fVar86 * fVar106 * 0.0 +
                                                                      fVar86 * fVar98 * fVar32) +
                                                             fVar142 * (fVar99 * fVar106 * fVar28 +
                                                                       fVar99 * fVar98 * fVar20 +
                                                                       fVar86 * fVar106 * fVar24 +
                                                                       fVar86 * fVar98 * fVar16);
                                                        cz1.m_data[1] =
                                                             fVar87 * (fVar99 * fVar106 * 0.0 +
                                                                      fVar99 * fVar98 * 0.0 +
                                                                      fVar86 * fVar106 * 0.0 +
                                                                      fVar86 * fVar98 * fVar33) +
                                                             fVar142 * (fVar99 * fVar106 * fVar29 +
                                                                       fVar99 * fVar98 * fVar21 +
                                                                       fVar86 * fVar106 * fVar25 +
                                                                       fVar86 * fVar98 * fVar17);
                                                        cz1.m_data[2] =
                                                             fVar87 * (fVar99 * fVar106 * 0.0 +
                                                                      fVar99 * fVar98 * 0.0 +
                                                                      fVar86 * fVar106 * 0.0 +
                                                                      fVar86 * fVar98 * 0.0) +
                                                             fVar142 * (fVar99 * fVar106 * fVar30 +
                                                                       fVar99 * fVar98 * fVar22 +
                                                                       fVar86 * fVar106 * fVar26 +
                                                                       fVar86 * fVar98 * fVar18);
                                                        cz1.m_data[3] =
                                                             fVar87 * (fVar99 * fVar106 * 0.0 +
                                                                      fVar99 * fVar98 * 0.0 +
                                                                      fVar86 * fVar106 * 0.0 +
                                                                      fVar86 * fVar98 * 0.0) +
                                                             fVar142 * (fVar99 * fVar106 * fVar31 +
                                                                       fVar99 * fVar98 * fVar23 +
                                                                       fVar86 * fVar106 * fVar27 +
                                                                       fVar86 * fVar98 * fVar19);
                                                        bVar43 = isLinearRangeValid((tcu *)prec,
                                                                                    (LookupPrecision
                                                                                     *)&res,&cz1,
                                                                                    result,pVVar63,
                                                                                    pVVar64);
                                                        if (bVar43) goto LAB_00a92978;
                                                      }
                                                      fVar120 = fVar120 + fVar83;
                                                    } while (fVar120 < fVar83 + fVar118);
                                                  }
                                                }
                                              }
                                              fVar140 = fVar140 + fVar83;
                                            } while (fVar140 < fVar123 + fVar83);
                                          }
                                          fVar135 = fVar135 + fVar83;
                                        } while (fVar135 < fVar130 + fVar83);
                                      }
                                    }
                                  }
                                  iVar52 = c_00;
                                } while (c_00 <= (int)fVar73);
                              }
                              iVar50 = iVar51;
                            } while (iVar51 <= (int)fVar81);
                          }
                          iVar65 = iVar49;
                        } while (iVar49 <= (int)fVar80);
                      }
                      iVar65 = c;
                    } while (c <= (int)fVar79);
                  }
                  iVar14 = iVar48;
                } while (iVar48 <= (int)fVar75);
              }
              iVar13 = iVar47;
            } while (iVar47 <= iVar44);
          }
        }
        else {
          WVar2 = sampler_00->wrapR;
          FVar60 = sampler_00->minFilter;
          WVar3 = sampler_01->wrapR;
          FVar4 = sampler_01->minFilter;
          FVar5 = sampler_00->magFilter;
          FVar6 = sampler_01->magFilter;
          TexVerifierUtil::computeNonNormalizedCoordBounds
                    ((TexVerifierUtil *)&uBounds0_1,sampler->normalizedCoords,WVar2,coord->m_data[0]
                     ,(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
          TexVerifierUtil::computeNonNormalizedCoordBounds
                    ((TexVerifierUtil *)&res,sampler->normalizedCoords,WVar3,coord->m_data[0],
                     (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
          TexVerifierUtil::computeNonNormalizedCoordBounds
                    ((TexVerifierUtil *)&cz1,sampler->normalizedCoords,FVar60,coord->m_data[1],
                     (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
          TexVerifierUtil::computeNonNormalizedCoordBounds
                    ((TexVerifierUtil *)&uBounds0,sampler->normalizedCoords,FVar4,coord->m_data[1],
                     (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
          TexVerifierUtil::computeNonNormalizedCoordBounds
                    ((TexVerifierUtil *)&uBounds1,sampler->normalizedCoords,FVar5,coord->m_data[2],
                     (prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
          TexVerifierUtil::computeNonNormalizedCoordBounds
                    ((TexVerifierUtil *)&vBounds0,sampler->normalizedCoords,FVar6,coord->m_data[2],
                     (prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
          fVar73 = uBounds0_1.m_data[1];
          fVar79 = floorf(uBounds0_1.m_data[0]);
          fVar80 = floorf(fVar73);
          fVar81 = floorf((float)res.m_data);
          fVar74 = floorf(fStack_624);
          fVar73 = cz1.m_data[1];
          fVar75 = floorf(cz1.m_data[0]);
          fVar76 = floorf(fVar73);
          fVar73 = uBounds0.m_data[1];
          fVar77 = floorf(uBounds0.m_data[0]);
          fVar78 = floorf(fVar73);
          fVar73 = uBounds1.m_data[1];
          fVar129 = floorf(uBounds1.m_data[0]);
          fVar125 = floorf(fVar73);
          fVar73 = vBounds0.m_data[1];
          fVar127 = floorf(vBounds0.m_data[0]);
          fVar73 = floorf(fVar73);
          local_7c8 = (undefined1  [4])(int)fVar129;
          if ((int)fVar129 <= (int)fVar125) {
            do {
              for (iVar44 = (int)fVar75; iVar13 = (int)fVar79, iVar44 <= (int)fVar76;
                  iVar44 = iVar44 + 1) {
                for (; uVar46 = (int)fVar127, iVar13 <= (int)fVar80; iVar13 = iVar13 + 1) {
                  for (; (int)uVar46 <= (int)fVar73; uVar46 = uVar46 + 1) {
                    pVVar64 = (Vec4 *)(ulong)(uint)(int)fVar73;
                    pVVar63 = (Vec2 *)(ulong)(uint)(int)fVar127;
                    for (iVar47 = (int)fVar77; iVar14 = (int)fVar81, iVar47 <= (int)fVar78;
                        iVar47 = iVar47 + 1) {
                      for (; iVar14 <= (int)fVar74; iVar14 = iVar14 + 1) {
                        iVar48 = TexVerifierUtil::wrap(sampler->wrapS,iVar13,WVar2);
                        iVar65 = TexVerifierUtil::wrap(sampler->wrapT,iVar44,FVar60);
                        uVar56 = TexVerifierUtil::wrap(sampler->wrapR,(int)local_7c8,FVar5);
                        if (((((iVar48 < 0) || ((int)sampler_00->wrapR <= iVar48)) || (iVar65 < 0))
                            || (((int)sampler_00->minFilter <= iVar65 || ((int)uVar56 < 0)))) ||
                           ((int)sampler_00->magFilter <= (int)uVar56)) {
                          sampleTextureBorder<float>((TextureFormat *)&quad01,sampler_00);
                        }
                        else {
                          pVVar63 = (Vec2 *)(ulong)uVar56;
                          ConstPixelBufferAccess::getPixel
                                    ((ConstPixelBufferAccess *)&quad00,(int)sampler_00,iVar48,iVar65
                                    );
                          format.order = sampler_00->wrapS;
                          format.type = sampler_00->wrapT;
                          bVar43 = isSRGB(format);
                          if (bVar43) {
                            sRGBToLinear((tcu *)&quad01,&quad00.p00);
                          }
                          else {
                            quad01.p00.m_data[0] = quad00.p00.m_data[0];
                            quad01.p00.m_data[1] = quad00.p00.m_data[1];
                            quad01.p00.m_data[2] = quad00.p00.m_data[2];
                            quad01.p00.m_data[3] = quad00.p00.m_data[3];
                          }
                        }
                        iVar48 = TexVerifierUtil::wrap(sampler->wrapS,iVar14,WVar3);
                        iVar65 = TexVerifierUtil::wrap(sampler->wrapT,iVar47,FVar4);
                        uVar56 = TexVerifierUtil::wrap(sampler->wrapR,uVar46,FVar6);
                        if (((iVar48 < 0) || ((int)sampler_01->wrapR <= iVar48)) ||
                           ((iVar65 < 0 ||
                            ((((int)sampler_01->minFilter <= iVar65 || ((int)uVar56 < 0)) ||
                             ((int)sampler_01->magFilter <= (int)uVar56)))))) {
                          sampleTextureBorder<float>((TextureFormat *)&quad10,sampler_01);
                        }
                        else {
                          pVVar63 = (Vec2 *)(ulong)uVar56;
                          ConstPixelBufferAccess::getPixel
                                    ((ConstPixelBufferAccess *)&quad00,(int)sampler_01,iVar48,iVar65
                                    );
                          format_00.order = sampler_01->wrapS;
                          format_00.type = sampler_01->wrapT;
                          bVar43 = isSRGB(format_00);
                          if (bVar43) {
                            sRGBToLinear((tcu *)&quad10,&quad00.p00);
                          }
                          else {
                            quad10.p00.m_data[0] = quad00.p00.m_data[0];
                            quad10.p00.m_data[1] = quad00.p00.m_data[1];
                            quad10.p00.m_data[2] = quad00.p00.m_data[2];
                            quad10.p00.m_data[3] = quad00.p00.m_data[3];
                          }
                        }
                        bVar43 = isLinearRangeValid((tcu *)prec,(LookupPrecision *)&quad01,
                                                    &quad10.p00,result,pVVar63,pVVar64);
                        if (bVar43) goto LAB_00a92978;
                      }
                    }
                  }
                }
              }
              iVar44 = (int)local_7c8 + 1;
              local_7c8 = (undefined1  [4])iVar44;
            } while (iVar44 <= (int)fVar125);
          }
        }
      }
      goto LAB_00a9297a;
    }
    if ((FVar60 == LINEAR_MIPMAP_NEAREST) || (FVar60 == NEAREST_MIPMAP_NEAREST)) {
      fVar73 = ceilf(fVar73 + 0.5);
      uVar67 = (int)fVar73 - 1;
      uVar66 = uVar56;
      if ((int)uVar67 < (int)uVar56) {
        uVar66 = uVar67;
      }
      uVar46 = 0;
      if ((int)uVar67 < 0) {
        uVar66 = uVar46;
      }
      fVar73 = floorf(fVar79 + 0.5);
      uVar67 = (uint)fVar73;
      if ((int)uVar67 < (int)uVar56) {
        uVar56 = uVar67;
      }
      if ((int)uVar67 < 0) {
        uVar56 = uVar46;
      }
      if ((int)uVar56 < (int)uVar66) goto LAB_00a9297a;
      do {
        uVar46 = sampler->minFilter - LINEAR;
        FVar60 = NEAREST;
        if (uVar46 < 5) {
          FVar60 = *(FilterMode *)(&DAT_00b96960 + (ulong)uVar46 * 4);
        }
        bVar43 = isLevelSampleResultValid
                           (texture->m_levels + (int)uVar66,sampler,FVar60,prec,coord,result);
        if (bVar43) goto LAB_00a92978;
        uVar66 = uVar66 + 1;
      } while ((int)uVar66 <= (int)uVar56);
    }
    else {
      bVar43 = isLevelSampleResultValid(texture->m_levels,sampler,FVar60,prec,coord,result);
      if (bVar43) {
LAB_00a92978:
        uVar46 = 1;
        goto LAB_00a9297a;
      }
    }
  }
  else if (fVar80 < fVar79) goto LAB_00a90abf;
  uVar46 = 0;
LAB_00a9297a:
  return SUB41(uVar46,0);
}

Assistant:

bool isLookupResultValid (const Texture3DView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec3& coord, const Vec2& lodBounds, const Vec4& result)
{
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	if (canBeMagnified)
	{
		if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coord, result))
			return true;
	}

	if (canBeMinified)
	{
		const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
		const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
		const int	minTexLevel		= 0;
		const int	maxTexLevel		= texture.getNumLevels()-1;

		DE_ASSERT(minTexLevel <= maxTexLevel);

		if (isLinearMipmap && minTexLevel < maxTexLevel)
		{
			const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
				const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

				if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coord, Vec2(minF, maxF), result))
					return true;
			}
		}
		else if (isNearestMipmap)
		{
			// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
			//		 decision to allow floor(lod + 0.5) as well.
			const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coord, result))
					return true;
			}
		}
		else
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coord, result))
				return true;
		}
	}

	return false;
}